

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::readVarBlock<unsigned_long>
              (Engine *fp,IO *io,Variable<unsigned_long> *variable,size_t step,size_t blockid,
              Dims *Count,Dims Start)

{
  long lVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  size_type __new_size;
  ulong uVar9;
  uint64_t uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int tdims;
  ulong uVar18;
  bool bVar19;
  ulong local_420;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dataV;
  Dims startv;
  Dims countv;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_380;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t count_t [16];
  uint64_t readn [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  
  dataV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dataV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = *(ulong *)(variable + 0x30);
  if (timestep == '\0') {
    uVar4 = adios2::core::VariableBase::GetAvailableStepsCount();
  }
  else {
    uVar4 = 1;
  }
  lVar13 = *(long *)(variable + 0x90);
  lVar1 = *(long *)(variable + 0x88);
  if ((int)uVar4 < 2) {
    iVar5 = 0;
  }
  else {
    uVar14 = (ulong)((uint)(istart >> 0x3f) & uVar4) + istart;
    lVar17 = (((ulong)uVar4 + icount) - uVar14) + 1;
    if (-1 < icount) {
      lVar17 = icount;
    }
    if (2 < verbose) {
      printf("    time: st=%lu ct=%lu\n",uVar14,lVar17);
    }
    if ((step < uVar14) || (lVar17 + uVar14 <= step)) goto LAB_00140415;
    iVar5 = 1;
  }
  uVar18 = (ulong)(lVar13 - lVar1) >> 3;
  local_420 = 1;
  tdims = (int)uVar18;
  uVar14 = 0;
  if (0 < tdims) {
    uVar14 = uVar18 & 0xffffffff;
  }
  bVar19 = false;
  for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
    lVar13 = (ulong)(uint)(iVar5 << 3) + uVar18 * 8;
    uVar15 = *(ulong *)((long)&istart + lVar13);
    puVar2 = (Count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)uVar15 < 0) {
      uVar15 = uVar15 + puVar2[uVar18];
    }
    uVar16 = *(ulong *)((long)&icount + lVar13);
    uVar7 = puVar2[uVar18];
    uVar9 = (uVar16 - uVar15) + 1 + uVar7;
    if (-1 < (long)uVar16) {
      uVar9 = uVar16;
    }
    if (uVar7 < uVar15) {
      bVar19 = true;
    }
    uVar16 = uVar7 - uVar15;
    if (uVar9 < uVar7 - uVar15) {
      uVar16 = uVar9;
    }
    if (uVar7 < uVar15) {
      uVar16 = uVar9;
    }
    if (2 < verbose) {
      printf("    j=%d, st=%lu ct=%lu\n",uVar18 & 0xffffffff,uVar15,uVar16);
    }
    start_t[uVar18] = uVar15;
    count_t[uVar18] = uVar16;
    local_420 = local_420 * uVar16;
    if (1 < verbose) {
      printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",uVar18 & 0xffffffff,uVar15,uVar18 & 0xffffffff,
             uVar16,local_420);
    }
  }
  if (1 < verbose) {
    printf(" total size of data to read = %lu\n",local_420 * uVar6);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_350,Count);
  print_slice_info((VariableBase *)variable,false,start_t,count_t,(Dims *)&local_350);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_350);
  if (!bVar19) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar6;
    uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar3,0);
    if (local_420 < uVar6) {
      uVar6 = local_420;
    }
    if (1 < verbose) {
      puts("Read size strategy:");
    }
    uVar18 = 1;
    uVar11 = tdims - 1;
    uVar15 = uVar18;
    for (uVar12 = uVar11; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      if (uVar18 < uVar6) {
        uVar7 = uVar6 / (uVar18 & 0xffffffff);
        uVar16 = count_t[uVar12];
        if (uVar7 < count_t[uVar12]) {
          uVar16 = uVar7;
        }
        readn[uVar12] = uVar16;
      }
      else {
        readn[uVar12] = 1;
        uVar16 = 1;
      }
      if (1 < verbose) {
        printf("    dim %d: read %lu elements\n",(ulong)uVar12,uVar16);
      }
      uVar18 = uVar18 * count_t[uVar12];
      uVar15 = uVar15 * uVar16;
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",uVar15,uVar18,local_420);
    }
    for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
      s[uVar6] = start_t[uVar6];
      c[uVar6] = readn[uVar6];
      iVar5 = ndigits((start_t[uVar6] + count_t[uVar6]) - 1);
      ndigits_dims[uVar6] = iVar5;
    }
    for (uVar6 = 0; uVar6 < local_420; uVar6 = uVar6 + lVar13) {
      lVar13 = 1;
      for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
        lVar13 = lVar13 * c[uVar18];
      }
      uVar10 = s[(int)uVar11];
      uVar8 = c[(int)uVar11];
      for (uVar12 = tdims - 2; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
        uVar10 = uVar10 + s[uVar12] * uVar8;
        uVar8 = uVar8 * c[uVar12];
      }
      if (2 < verbose) {
        printf("adios_read_var name=%s ",*(undefined8 *)(variable + 8));
        printf("%s = { ","  start");
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          printf("%lu ",s[uVar18]);
        }
        putchar(0x7d);
        printf("%s = { ","  count");
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          printf("%lu ",c[uVar18]);
        }
        putchar(0x7d);
        printf("  read %lu elems\n",lVar13);
      }
      if (1 < verbose) {
        printf("    read block %zu from offset %lu nelems %lu)\n",blockid,uVar10);
      }
      adios2::helper::Uint64ArrayToSizetVector((ulong)&startv,(ulong *)(long)tdims);
      adios2::helper::Uint64ArrayToSizetVector((ulong)&countv,(ulong *)(long)tdims);
      if (*(int *)(variable + 0x40) == 2) {
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          startv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               startv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18] +
               *(long *)(*Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar18 * 8);
        }
      }
      if (2 < verbose) {
        printf("set selection: ");
        printf("%s = { ","  start");
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          printf("%zu ",startv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18]);
        }
        putchar(0x7d);
        printf("%s = { ","  count");
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          printf("%zu ",countv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18]);
        }
        putchar(0x7d);
        putchar(10);
      }
      if (variable[0x54] == (Variable<unsigned_long>)0x0) {
        if (*(int *)(variable + 0x40) == 5) {
          adios2::core::VariableBase::SetBlockSelection((ulong)variable);
        }
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (&local_380,&startv,&countv);
        adios2::core::VariableBase::SetSelection((pair *)variable);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(&local_380);
      }
      if (1 < (int)uVar4) {
        if (2 < verbose) {
          printf("set Step selection: from %lu read %lu steps\n",s[0],c[0]);
        }
        local_380.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x1;
        local_380.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)step;
        adios2::core::VariableBase::SetStepSelection((pair *)variable);
      }
      __new_size = adios2::core::Variable<unsigned_long>::SelectionSize();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&dataV,__new_size);
      adios2::core::Engine::Get<unsigned_long>((Variable *)fp,variable,(Mode)&dataV);
      print_dataset(dataV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),s,c,tdims,
                    ndigits_dims);
      bVar19 = true;
      for (uVar12 = uVar11; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
        if (bVar19) {
          uVar18 = count_t[uVar12] + start_t[uVar12];
          bVar19 = c[uVar12] + s[uVar12] == uVar18;
          if (bVar19) {
            s[uVar12] = start_t[uVar12];
            uVar10 = readn[uVar12];
          }
          else {
            uVar10 = s[uVar12] + readn[uVar12];
            s[uVar12] = uVar10;
            if (c[uVar12] + uVar10 <= uVar18) goto LAB_001403e7;
            uVar10 = uVar18 - uVar10;
          }
          c[uVar12] = uVar10;
        }
        else {
LAB_001403e7:
          bVar19 = false;
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&countv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&startv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    print_endline();
  }
LAB_00140415:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&dataV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int readVarBlock(core::Engine *fp, core::IO *io, core::Variable<T> *variable, size_t step,
                 size_t blockid, Dims Count, Dims Start)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    uint64_t nelems; // number of elements to read
    int tidx;
    uint64_t st, ct;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    bool incdim;              // used in incremental reading in
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Count.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;

    if (nsteps > 1)
    {
        if (istart[0] < 0) // negative index means last-|index|
            st = nsteps + istart[0];
        else
            st = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            ct = nsteps + icount[0] + 1 - st;
        else
            ct = icount[0];

        if (verbose > 2)
            printf("    time: st=%" PRIu64 " ct=%" PRIu64 "\n", st, ct);

        // check if this block falls into the requested time
        if (step < st || step >= st + ct)
            return 0;
        tidx = 1;
    }

    int out_of_bound = 0;
    for (j = 0; j < ndim; j++)
    {
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = Count[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = Count[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (st > Count[j])
        {
            out_of_bound = 1;
        }
        else if (ct > Count[j] - st)
        {
            ct = Count[j] - st;
        }
        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j, st, ct);

        start_t[j] = st;
        count_t[j] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j, start_t[j], j,
                   count_t[j], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, false, start_t, count_t, Count);

    if (out_of_bound)
        return 0;

    maxreadn = MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    // allocate data array
    // data = (void *)malloc(maxreadn * elemsize + 8); // +8 for just to be
    // sure

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = ndim - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < ndim; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < ndim; j++)
            actualreadn *= c[j];

        uint64_t startoffset = s[ndim - 1];
        uint64_t tmpprod = c[ndim - 1];
        for (i = ndim - 2; i >= 0; i--)
        {
            startoffset += s[i] * tmpprod;
            tmpprod *= c[i];
        }

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, ndim, j);
            PRINT_DIMS_UINT64("  count", c, ndim, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }
        if (verbose > 1)
            printf("    read block %zu from offset %" PRIu64 " nelems %" PRIu64 ")\n", blockid,
                   startoffset, actualreadn);

        // read a slice finally
        Dims startv = helper::Uint64ArrayToSizetVector(ndim, s);
        Dims countv = helper::Uint64ArrayToSizetVector(ndim, c);

        /* In current implementation we read with global selection, so
         * we need to adjust start_t for global offsets here.
         * TODO: this will change in the future to block reading with
         * relative
         * selection
         */
        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            for (j = 0; j < ndim; j++)
            {
                startv[j] += Start[j];
            }
        }

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), ndim, j);
            PRINT_DIMS_SIZET("  count", countv.data(), ndim, j);
            printf("\n");
        }

        if (!variable->m_SingleValue)
        {
            if (variable->m_ShapeID == ShapeID::LocalArray)
            {
                variable->SetBlockSelection(blockid);
            }
            variable->SetSelection({startv, countv});
        }

        if (nsteps > 1)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from %" PRIu64 " read %" PRIu64 " steps\n", s[0], c[0]);
            }
            variable->SetStepSelection({step, 1});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);
        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, ndim, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        incdim = true; // largest dim should be increased
        for (j = ndim - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // next smaller dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();
    return 0;
}